

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
::Iterator::Iterator(Iterator *this,Iterator *other)

{
  Iterator *other_local;
  Iterator *this_local;
  
  memset(this,0,8);
  ParamIteratorInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>::
  ParamIteratorInterface
            (&this->
              super_ParamIteratorInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
            );
  (this->
  super_ParamIteratorInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_029ff9f8;
  this->base_ = other->base_;
  (this->iterator_)._M_current = (other->iterator_)._M_current;
  std::
  unique_ptr<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode_const,std::default_delete<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode_const>>
  ::
  unique_ptr<std::default_delete<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode_const>,void>
            ((unique_ptr<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode_const,std::default_delete<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode_const>>
              *)&this->value_);
  return;
}

Assistant:

Iterator(const Iterator& other)
        // The explicit constructor call suppresses a false warning
        // emitted by gcc when supplied with the -Wextra option.
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          iterator_(other.iterator_) {}